

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_el_hahn.cpp
# Opt level: O3

void __thiscall
PP_el_hahn::multiChromeDiffusion
          (PP_el_hahn *this,double mx0,double my0,double mz0,int N,bool rotFrame)

{
  C_matrix<double> *this_00;
  C_matrix<double> *this_01;
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  undefined4 in_register_00000034;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  C_matrix<double> MUsecondFID1;
  C_matrix<double> MUsecondPulse1;
  C_matrix<double> MUfirstFID1;
  C_matrix<double> MUfisrtPulse1;
  C_matrix<double> MUsteady1;
  C_matrix<double> local_530;
  double local_508;
  double *local_500;
  double local_4f8;
  double dStack_4f0;
  undefined8 local_4e8;
  double local_4e0;
  undefined1 local_4d8 [16];
  double local_4c0;
  C_matrix<double> local_4b8;
  C_matrix<double> local_490;
  C_matrix<double> local_468;
  C_matrix<double> local_440;
  C_matrix<double> local_418;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double local_3d0;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  C_matrix<double> local_288;
  C_matrix<double> local_260;
  C_matrix<double> local_238;
  C_matrix<double> local_210;
  C_matrix<double> local_1e8;
  C_matrix<double> local_1c0;
  C_matrix<double> local_198;
  C_matrix<double> local_170;
  C_matrix<double> local_148;
  C_matrix<double> local_120;
  C_matrix<double> local_f8;
  C_matrix<double> local_d0;
  C_matrix<double> local_a8;
  C_matrix<double> local_80;
  C_matrix<double> local_58;
  
  local_4d8._8_8_ = local_4d8._0_8_;
  local_4e8 = CONCAT44(in_register_00000034,N);
  local_418._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  local_418.m_L = 0;
  local_418.m_C = 0;
  local_418.m_A = (double *)0x0;
  local_418.endL = -1;
  local_418.endC = -1;
  local_440._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  local_440.m_L = 0;
  local_440.m_C = 0;
  local_440.m_A = (double *)0x0;
  local_440.endL = -1;
  local_440.endC = -1;
  local_468._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  local_468.m_L = 0;
  local_468.m_C = 0;
  local_468.m_A = (double *)0x0;
  local_468.endL = -1;
  local_468.endC = -1;
  local_490._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  local_490.m_L = 0;
  local_490.m_C = 0;
  local_490.m_A = (double *)0x0;
  local_490.endL = -1;
  local_490.endC = -1;
  local_4b8._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  local_4b8.m_L = 0;
  local_4b8.m_C = 0;
  local_4b8.m_A = (double *)0x0;
  local_4b8.endL = -1;
  local_4b8.endC = -1;
  local_4f8 = (this->super_PP_sigRMN).Bz0;
  dStack_4f0 = (this->super_PP_sigRMN).Bxy;
  local_4c0 = (this->super_PP_sigRMN).muz0;
  local_3e8 = (this->super_PP_sigRMN).T1;
  dVar10 = (this->super_PP_sigRMN).gamma;
  (this->super_PP_sigRMN).muz0 = (0.0 / (local_4f8 * dVar10) + 1.0) * local_4c0;
  (this->super_PP_sigRMN).Bz0 = 0.0 / dVar10 + local_4f8;
  (this->super_PP_sigRMN).Bxy = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  dVar10 = (this->super_PP_sigRMN).T2;
  if (local_3e8 <= dVar10) {
    local_3e8 = dVar10;
  }
  (this->super_PP_sigRMN).sigLength = 200;
  local_3e8 = local_3e8 / 200.0;
  local_3e0 = mx0;
  local_3d8 = my0;
  local_3d0 = mz0;
  dVar3 = PP_sigRMN::generateFIDsignalWithDiffusion
                    (&this->super_PP_sigRMN,mx0,my0,mz0,local_3e8,0.0);
  this_00 = &(this->super_PP_sigRMN).MU;
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  dVar10 = *pdVar4;
  local_500 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  local_500 = (double *)*local_500;
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  local_4d8._0_8_ = *pdVar4;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar3 + 0.0);
  }
  C_matrix<double>::operator=(&local_58,&local_418,this_00);
  local_58._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_58.m_A != (double *)0x0) {
    operator_delete__(local_58.m_A);
  }
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"initSigTime.txt","");
  this_01 = &(this->super_PP_sigRMN).T;
  C_matrix<double>::save(this_01,&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  dVar1 = (this->super_PP_sigRMN).gamma;
  dVar8 = 0.0 / dVar1 + local_4f8;
  (this->super_PP_sigRMN).Bz0 = dVar8;
  (this->super_PP_sigRMN).Bxy = dStack_4f0;
  (this->super_PP_sigRMN).omega = dVar8 * dVar1;
  (this->super_PP_sigRMN).sigLength = 4000;
  dVar1 = PP_sigRMN::generateRMNsignal
                    (&this->super_PP_sigRMN,dVar10,(double)local_500,(double)local_4d8._0_8_,
                     (this->super_PP_sigRMN).tw / 4000.0,0.0);
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  local_4d8._0_8_ = *pdVar4;
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  dVar10 = *pdVar4;
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  dVar1 = dVar3 + 0.0 + dVar1;
  dVar3 = *pdVar4;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar1);
  }
  C_matrix<double>::operator=(&local_80,&local_440,this_00);
  local_80._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_80.m_A != (double *)0x0) {
    operator_delete__(local_80.m_A);
  }
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"p90Time.txt","");
  C_matrix<double>::save(this_01,&local_2c8);
  local_500 = &(this->super_PP_sigRMN).Bxy;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  (this->super_PP_sigRMN).Bz0 = 0.0 / (this->super_PP_sigRMN).gamma + local_4f8;
  *local_500 = 0.0;
  local_500[1] = 0.0;
  (this->super_PP_sigRMN).sigLength = 4000;
  dVar8 = PP_sigRMN::generateFIDsignalWithDiffusion
                    (&this->super_PP_sigRMN,(double)local_4d8._0_8_,dVar10,dVar3,
                     ((this->super_PP_sigRMN).TE * 0.5 - (this->super_PP_sigRMN).tw) / 4000.0,0.0);
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  dVar10 = *pdVar4;
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  dVar3 = *pdVar4;
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  dVar1 = dVar1 + dVar8;
  dVar8 = *pdVar4;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar1);
  }
  C_matrix<double>::operator=(&local_a8,&local_468,this_00);
  local_a8._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_a8.m_A != (double *)0x0) {
    operator_delete__(local_a8.m_A);
  }
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"fidTime.txt","");
  C_matrix<double>::save(this_01,&local_2e8);
  local_4d8._8_4_ = SUB84(dStack_4f0,0);
  local_4d8._0_8_ = dStack_4f0;
  local_4d8._12_4_ = (int)((ulong)dStack_4f0 >> 0x20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  dVar2 = (this->super_PP_sigRMN).gamma;
  dVar9 = 0.0 / dVar2 + local_4f8;
  (this->super_PP_sigRMN).Bz0 = dVar9;
  (this->super_PP_sigRMN).Bxy = (double)local_4d8._0_8_;
  (this->super_PP_sigRMN).omega = dVar9 * dVar2;
  (this->super_PP_sigRMN).sigLength = 4000;
  dVar8 = PP_sigRMN::generateRMNsignal
                    (&this->super_PP_sigRMN,dVar10,dVar3,dVar8,(this->super_PP_sigRMN).tw / 4000.0,
                     0.0);
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  dVar10 = *pdVar4;
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  dVar3 = *pdVar4;
  pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  dVar1 = dVar1 + dVar8;
  dVar8 = *pdVar4;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar1);
  }
  C_matrix<double>::operator=(&local_d0,&local_490,this_00);
  local_d0._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_d0.m_A != (double *)0x0) {
    operator_delete__(local_d0.m_A);
  }
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"p180Time.txt","");
  C_matrix<double>::save(this_01,&local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  (this->super_PP_sigRMN).Bz0 = 0.0 / (this->super_PP_sigRMN).gamma + local_4f8;
  *local_500 = 0.0;
  local_500[1] = 0.0;
  (this->super_PP_sigRMN).sigLength = 4000;
  dVar10 = PP_sigRMN::generateFIDsignalWithDiffusion
                     (&this->super_PP_sigRMN,dVar10,dVar3,dVar8,
                      (((this->super_PP_sigRMN).TE - (this->super_PP_sigRMN).tw) * 1.5) / 4000.0,0.0
                     );
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar1 + dVar10);
  }
  C_matrix<double>::operator=(&local_f8,&local_4b8,this_00);
  local_f8._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_f8.m_A != (double *)0x0) {
    operator_delete__(local_f8.m_A);
  }
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"spinEchoTime.txt","");
  C_matrix<double>::save(this_01,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  (this->super_PP_sigRMN).Bz0 = local_4f8;
  (this->super_PP_sigRMN).Bxy = dStack_4f0;
  dVar10 = (this->super_PP_sigRMN).gamma;
  uVar6 = SUB84(dVar10,0);
  uVar7 = (undefined4)((ulong)dVar10 >> 0x20);
  (this->super_PP_sigRMN).omega = local_4f8 * dVar10;
  (this->super_PP_sigRMN).muz0 = local_4c0;
  if (0 < (int)local_4e8) {
    local_3f0 = (double)((int)local_4e8 + -1);
    iVar5 = 0;
    do {
      dVar10 = (this->super_PP_sigRMN).DW;
      dVar10 = ((double)iVar5 * (dVar10 + dVar10)) / local_3f0 - dVar10;
      (this->super_PP_sigRMN).muz0 =
           (dVar10 / (local_4f8 * (double)CONCAT44(uVar7,uVar6)) + 1.0) * local_4c0;
      (this->super_PP_sigRMN).Bz0 = dVar10 / (double)CONCAT44(uVar7,uVar6) + local_4f8;
      *local_500 = 0.0;
      local_500[1] = 0.0;
      (this->super_PP_sigRMN).sigLength = 200;
      dVar8 = PP_sigRMN::generateFIDsignalWithDiffusion
                        (&this->super_PP_sigRMN,local_3e0,local_3d8,local_3d0,local_3e8,dVar10);
      pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
      dVar3 = *pdVar4;
      pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
      dVar1 = *pdVar4;
      pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
      local_508 = *pdVar4;
      if (!rotFrame) {
        PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar8 + 0.0);
      }
      C_matrix<double>::operator+(&local_530,this_00,&local_418);
      C_matrix<double>::operator=(&local_120,&local_418,&local_530);
      local_120._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
      if (local_120.m_A != (double *)0x0) {
        operator_delete__(local_120.m_A);
      }
      local_530._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
      if (local_530.m_A != (double *)0x0) {
        operator_delete__(local_530.m_A);
      }
      dVar2 = (this->super_PP_sigRMN).gamma;
      dVar9 = dVar10 / dVar2 + local_4f8;
      (this->super_PP_sigRMN).Bz0 = dVar9;
      (this->super_PP_sigRMN).Bxy = (double)local_4d8._0_8_;
      (this->super_PP_sigRMN).omega = dVar9 * dVar2;
      (this->super_PP_sigRMN).sigLength = 4000;
      dVar2 = PP_sigRMN::generateRMNsignal
                        (&this->super_PP_sigRMN,dVar3,dVar1,local_508,
                         (this->super_PP_sigRMN).tw / 4000.0,dVar10);
      pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
      dVar3 = *pdVar4;
      pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
      local_508 = *pdVar4;
      pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
      dVar2 = dVar8 + 0.0 + dVar2;
      dVar1 = *pdVar4;
      if (!rotFrame) {
        PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar2);
      }
      C_matrix<double>::operator+(&local_530,this_00,&local_440);
      C_matrix<double>::operator=(&local_148,&local_440,&local_530);
      local_148._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
      if (local_148.m_A != (double *)0x0) {
        operator_delete__(local_148.m_A);
      }
      local_530._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
      if (local_530.m_A != (double *)0x0) {
        operator_delete__(local_530.m_A);
      }
      (this->super_PP_sigRMN).Bz0 = dVar10 / (this->super_PP_sigRMN).gamma + local_4f8;
      *local_500 = 0.0;
      local_500[1] = 0.0;
      (this->super_PP_sigRMN).sigLength = 4000;
      dVar1 = PP_sigRMN::generateFIDsignalWithDiffusion
                        (&this->super_PP_sigRMN,dVar3,local_508,dVar1,
                         ((this->super_PP_sigRMN).TE * 0.5 - (this->super_PP_sigRMN).tw) / 4000.0,
                         dVar10);
      pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
      dVar3 = *pdVar4;
      pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
      local_508 = *pdVar4;
      pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
      dVar2 = dVar2 + dVar1;
      dVar1 = *pdVar4;
      if (!rotFrame) {
        PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar2);
      }
      C_matrix<double>::operator+(&local_530,this_00,&local_468);
      C_matrix<double>::operator=(&local_170,&local_468,&local_530);
      local_170._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
      if (local_170.m_A != (double *)0x0) {
        operator_delete__(local_170.m_A);
      }
      local_530._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
      if (local_530.m_A != (double *)0x0) {
        operator_delete__(local_530.m_A);
      }
      dVar8 = (this->super_PP_sigRMN).gamma;
      dVar9 = dVar10 / dVar8 + local_4f8;
      (this->super_PP_sigRMN).Bz0 = dVar9;
      (this->super_PP_sigRMN).Bxy = (double)local_4d8._0_8_;
      (this->super_PP_sigRMN).omega = dVar9 * dVar8;
      (this->super_PP_sigRMN).sigLength = 4000;
      dVar1 = PP_sigRMN::generateRMNsignal
                        (&this->super_PP_sigRMN,dVar3,local_508,dVar1,
                         (this->super_PP_sigRMN).tw / 4000.0,dVar10);
      pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
      dVar3 = *pdVar4;
      pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
      local_508 = *pdVar4;
      pdVar4 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
      dVar2 = dVar2 + dVar1;
      dVar1 = *pdVar4;
      if (!rotFrame) {
        PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar2);
      }
      C_matrix<double>::operator+(&local_530,this_00,&local_490);
      C_matrix<double>::operator=(&local_198,&local_490,&local_530);
      local_198._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
      if (local_198.m_A != (double *)0x0) {
        operator_delete__(local_198.m_A);
      }
      local_530._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
      if (local_530.m_A != (double *)0x0) {
        operator_delete__(local_530.m_A);
      }
      (this->super_PP_sigRMN).Bz0 = dVar10 / (this->super_PP_sigRMN).gamma + local_4f8;
      *local_500 = 0.0;
      local_500[1] = 0.0;
      (this->super_PP_sigRMN).sigLength = 4000;
      dVar10 = PP_sigRMN::generateFIDsignalWithDiffusion
                         (&this->super_PP_sigRMN,dVar3,local_508,dVar1,
                          (((this->super_PP_sigRMN).TE - (this->super_PP_sigRMN).tw) * 1.5) / 4000.0
                          ,dVar10);
      if (!rotFrame) {
        PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar2 + dVar10);
      }
      C_matrix<double>::operator+(&local_530,this_00,&local_4b8);
      C_matrix<double>::operator=(&local_1c0,&local_4b8,&local_530);
      local_1c0._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
      if (local_1c0.m_A != (double *)0x0) {
        operator_delete__(local_1c0.m_A);
      }
      local_530._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
      if (local_530.m_A != (double *)0x0) {
        operator_delete__(local_530.m_A);
      }
      (this->super_PP_sigRMN).Bz0 = local_4f8;
      (this->super_PP_sigRMN).Bxy = dStack_4f0;
      dVar10 = (this->super_PP_sigRMN).gamma;
      uVar6 = SUB84(dVar10,0);
      uVar7 = (undefined4)((ulong)dVar10 >> 0x20);
      (this->super_PP_sigRMN).omega = local_4f8 * dVar10;
      (this->super_PP_sigRMN).muz0 = local_4c0;
      iVar5 = iVar5 + 1;
    } while ((int)local_4e8 != iVar5);
  }
  dVar10 = 1.0 / (double)((int)local_4e8 + 1);
  local_4e0 = dVar10;
  C_matrix<double>::operator*(&local_530,&local_418,&local_4e0);
  C_matrix<double>::operator=(&local_1e8,&local_418,&local_530);
  local_1e8._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_1e8.m_A != (double *)0x0) {
    operator_delete__(local_1e8.m_A);
  }
  local_530._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_530.m_A != (double *)0x0) {
    operator_delete__(local_530.m_A);
  }
  local_4e0 = dVar10;
  C_matrix<double>::operator*(&local_530,&local_440,&local_4e0);
  C_matrix<double>::operator=(&local_210,&local_440,&local_530);
  local_210._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_210.m_A != (double *)0x0) {
    operator_delete__(local_210.m_A);
  }
  local_530._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_530.m_A != (double *)0x0) {
    operator_delete__(local_530.m_A);
  }
  local_4e0 = dVar10;
  C_matrix<double>::operator*(&local_530,&local_468,&local_4e0);
  C_matrix<double>::operator=(&local_238,&local_468,&local_530);
  local_238._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_238.m_A != (double *)0x0) {
    operator_delete__(local_238.m_A);
  }
  local_530._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_530.m_A != (double *)0x0) {
    operator_delete__(local_530.m_A);
  }
  local_4e0 = dVar10;
  C_matrix<double>::operator*(&local_530,&local_490,&local_4e0);
  C_matrix<double>::operator=(&local_260,&local_490,&local_530);
  local_260._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_260.m_A != (double *)0x0) {
    operator_delete__(local_260.m_A);
  }
  local_530._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_530.m_A != (double *)0x0) {
    operator_delete__(local_530.m_A);
  }
  local_4e0 = dVar10;
  C_matrix<double>::operator*(&local_530,&local_4b8,&local_4e0);
  C_matrix<double>::operator=(&local_288,&local_4b8,&local_530);
  local_288._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_288.m_A != (double *)0x0) {
    operator_delete__(local_288.m_A);
  }
  local_530._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_530.m_A != (double *)0x0) {
    operator_delete__(local_530.m_A);
  }
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"initSig.txt","");
  C_matrix<double>::save(&local_418,&local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"p90.txt","");
  C_matrix<double>::save(&local_440,&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"fid.txt","");
  C_matrix<double>::save(&local_468,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"p180.txt","");
  C_matrix<double>::save(&local_490,&local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"spinEcho.txt","");
  C_matrix<double>::save(&local_4b8,&local_3c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  local_4b8._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_4b8.m_A != (double *)0x0) {
    operator_delete__(local_4b8.m_A);
  }
  local_490._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_490.m_A != (double *)0x0) {
    operator_delete__(local_490.m_A);
  }
  local_468._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_468.m_A != (double *)0x0) {
    operator_delete__(local_468.m_A);
  }
  local_440._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_440.m_A != (double *)0x0) {
    operator_delete__(local_440.m_A);
  }
  local_418._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_418.m_A != (double *)0x0) {
    operator_delete__(local_418.m_A);
  }
  return;
}

Assistant:

void PP_el_hahn::multiChromeDiffusion(double mx0, double my0, double mz0, int N, bool rotFrame)
{
    C_matrix<double> MUsteady1;
    C_matrix<double> MUfisrtPulse1;
    C_matrix<double> MUfirstFID1;
    C_matrix<double> MUsecondPulse1;
    C_matrix<double> MUsecondFID1;
    //the perturbating magnetic field pulsation is gamma*Bz0, but the actual constant field is Bz0+(dw/gamma)
    double dt;
    double tmpBz0 = Bz0;
    double tmpBxy = Bxy;
    double tempMuz0=muz0;
    double dw=0.0;
    double tmpX=mx0, tmpY=my0, tmpZ=mz0;

    muz0 = tempMuz0*(1.0+(dw/(gamma*tmpBz0)));
    //std::cout << 1.0+(dw/(gamma*tmpBz0)) << " " << tempMuz0 << " " << muz0 << std::endl;

    /*****************************************************************/
    /** We first consider the simulation with a slightly larger field*/
    /******************************************************/
    /** initialization */
    //apply the constant magnetic field during t0
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    double t0=MAX(T1,T2);
    sigLength=200;
    dt=t0/((double) sigLength);
    double t00=0.0;

    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MUsteady1=MU;

    T.save("initSigTime.txt");


    /******************************************************/
    /** first pulse */
    //play one pi/2-pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=tmpBxy; omega=gamma*Bz0;
    sigLength=4000;
    dt=tw/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MUfisrtPulse1=MU;

    T.save("p90Time.txt");


    /******************************************************/
    /** free induction decay */
    //stop the radiofrequence pulse until the next pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    sigLength=4000;
    dt=(0.5*TE - tw)/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MUfirstFID1=MU;

    T.save("fidTime.txt");



    /******************************************************/
    /** second pulse */
    //play the pi-pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=tmpBxy; omega=gamma*Bz0;
    sigLength=4000;
    dt=tw/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MUsecondPulse1=MU;

    T.save("p180Time.txt");


    /******************************************************/
    /** spin echo */
    //stop the radiofrequence pulse until the next pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    sigLength=4000;
    dt=1.5*(TE-tw)/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    if(!rotFrame) frameToFix(t00);
    MUsecondFID1=MU;

    T.save("spinEchoTime.txt");

    //restore parameters
    Bz0=tmpBz0;
    Bxy=tmpBxy; omega=gamma*Bz0;
    muz0=tempMuz0;
    tmpX=mx0; tmpY=my0; tmpZ=mz0;



    for(int n=0 ; n<N ; n++)
    {
        t00=0.0;
        dw=-DW+2.0*DW*((double) n)/((double) (N-1));//
        //dw=2.0*DW*((((double) rand())/((double) RAND_MAX))-0.5);
        muz0 = tempMuz0*(1.0+(dw/(gamma*tmpBz0)));

        /*****************************************************************/
        /** We first consider the simulation with a slightly larger field*/
        /******************************************************/
        /** initialization */
        //apply the constant magnetic field during t0
        Bz0=tmpBz0+(dw/gamma);
        Bxy=0.0; omega=0;
        sigLength=200;
        dt=t0/((double) sigLength);

        //suppose that the magnetic momentum at rest is null
        t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
        tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
        if(!rotFrame) frameToFix(t00);
        MUsteady1=(MU+MUsteady1);
        //std::cout << t00 << std::endl;


        /******************************************************/
        /** first pulse */
        //play one pi/2-pulse
        Bz0=tmpBz0+(dw/gamma);
        Bxy=tmpBxy; omega=gamma*Bz0;
        sigLength=4000;
        dt=tw/((double) sigLength);

        //suppose that the magnetic momentum at rest is null
        t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
        tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
        if(!rotFrame) frameToFix(t00);
        MUfisrtPulse1=(MU+MUfisrtPulse1);
        //std::cout << t00 << std::endl;


        /******************************************************/
        /** free induction decay */
        //stop the radiofrequence pulse until the next pulse
        Bz0=tmpBz0+(dw/gamma);
        Bxy=0.0; omega=0;
        sigLength=4000;
        dt=(0.5*TE - tw)/((double) sigLength);

        //suppose that the magnetic momentum at rest is null
        t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
        tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
        if(!rotFrame) frameToFix(t00);
        MUfirstFID1=(MU+MUfirstFID1);



        /******************************************************/
        /** second pulse */
        //play the pi-pulse
        Bz0=tmpBz0+(dw/gamma);
        Bxy=tmpBxy; omega=gamma*Bz0;
        sigLength=4000;
        dt=tw/((double) sigLength);//2.0*

        //suppose that the magnetic momentum at rest is null
        t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
        tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
        if(!rotFrame) frameToFix(t00);
        MUsecondPulse1=(MU+MUsecondPulse1);
        //std::cout << t00 << std::endl;


        /******************************************************/
        /** spin echo */
        //stop the radiofrequence pulse until the next pulse
        Bz0=tmpBz0+(dw/gamma);
        Bxy=0.0; omega=0;
        sigLength=4000;
        dt=1.5*(TE-tw)/((double) sigLength);

        //suppose that the magnetic momentum at rest is null
        t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
        if(!rotFrame) frameToFix(t00);
        MUsecondFID1=(MU+MUsecondFID1);

        //restore the parameters
        Bz0=tmpBz0;
        Bxy=tmpBxy; omega=gamma*Bz0;
        muz0=tempMuz0;
        tmpX=mx0; tmpY=my0; tmpZ=mz0;
    }

    MUsteady1=MUsteady1*(1.0/((double) (N+1)));
    MUfisrtPulse1=MUfisrtPulse1*(1.0/((double) (N+1)));
    MUfirstFID1=MUfirstFID1*(1.0/((double) (N+1)));
    MUsecondPulse1=MUsecondPulse1*(1.0/((double) (N+1)));
    MUsecondFID1=MUsecondFID1*(1.0/((double) (N+1)));
    MUsteady1.save("initSig.txt");
    MUfisrtPulse1.save("p90.txt");
    MUfirstFID1.save("fid.txt");
    MUsecondPulse1.save("p180.txt");
    MUsecondFID1.save("spinEcho.txt");
    return;
}